

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_dictionary_impl.h
# Opt level: O0

int __thiscall
label::LabelDictionary<label::StringLabel>::insert
          (LabelDictionary<label::StringLabel> *this,StringLabel *l)

{
  pointer ppVar1;
  pair<std::__detail::_Node_iterator<std::pair<const_label::StringLabel,_int>,_false,_false>,_bool>
  pVar2;
  pair<const_label::StringLabel,_int> local_50;
  _Node_iterator_base<std::pair<const_label::StringLabel,_int>,_false> local_28;
  pair<std::__detail::_Node_iterator<std::pair<const_label::StringLabel,_int>,_false,_false>,_bool>
  label_in_dictionary;
  StringLabel *l_local;
  LabelDictionary<label::StringLabel> *this_local;
  
  label_in_dictionary._8_8_ = l;
  std::pair<const_label::StringLabel,_int>::pair<int_&,_true>(&local_50,l,&this->labels_count_);
  pVar2 = std::
          unordered_map<label::StringLabel,_int,_std::hash<label::StringLabel>,_std::equal_to<label::StringLabel>,_std::allocator<std::pair<const_label::StringLabel,_int>_>_>
          ::insert(&this->label_to_id_dictionary_,&local_50);
  local_28._M_cur =
       (__node_type *)
       pVar2.first.super__Node_iterator_base<std::pair<const_label::StringLabel,_int>,_false>._M_cur
  ;
  label_in_dictionary.first.
  super__Node_iterator_base<std::pair<const_label::StringLabel,_int>,_false>._M_cur._0_1_ =
       pVar2.second;
  std::pair<const_label::StringLabel,_int>::~pair(&local_50);
  if (((byte)label_in_dictionary.first.
             super__Node_iterator_base<std::pair<const_label::StringLabel,_int>,_false>._M_cur & 1)
      != 0) {
    std::vector<label::StringLabel,_std::allocator<label::StringLabel>_>::push_back
              (&this->id_to_label_dictionary_,(value_type *)label_in_dictionary._8_8_);
    this->labels_count_ = this->labels_count_ + 1;
  }
  ppVar1 = std::__detail::_Node_iterator<std::pair<const_label::StringLabel,_int>,_false,_false>::
           operator->((_Node_iterator<std::pair<const_label::StringLabel,_int>,_false,_false> *)
                      &local_28);
  return ppVar1->second;
}

Assistant:

int LabelDictionary<Label>::insert(const Label& l) {
  // Try to insert the given label with labels_count as its id value.
  // If the label is already in the dictionary, it (and its id) will not be
  // overwritten.
  auto label_in_dictionary = label_to_id_dictionary_.insert({l, labels_count_});
  // If the label wasn't in the dictionary, it was inserted.
  // Increase the labels count for consecutive labels.
  if (label_in_dictionary.second) {
    // Add the label at the corresponding index.
    id_to_label_dictionary_.push_back(l);
    ++labels_count_;
  }
  // Return the id of the given label.
  return label_in_dictionary.first->second;
}